

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  NodeRef *pNVar14;
  size_t sVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  size_t sVar17;
  size_t sVar18;
  long lVar19;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar20;
  uint uVar21;
  Primitive_conflict4 *prim;
  bool bVar22;
  byte bVar23;
  ulong uVar24;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar41;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar42;
  undefined1 auVar43 [64];
  vfloat_impl<4> __tmp;
  undefined1 in_ZMM1 [64];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar44;
  vint4 ai;
  undefined1 auVar45 [16];
  vint4 ai_1;
  undefined1 auVar46 [16];
  vint4 ai_3;
  undefined1 auVar47 [16];
  vint4 bi;
  undefined1 auVar48 [16];
  vint4 bi_1;
  undefined1 auVar49 [16];
  vint4 bi_3;
  undefined1 auVar50 [16];
  vint4 bi_2;
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  vbool<4>_conflict valid_leaf;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar25 [16];
  
  sVar17 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar17 != 8) {
    auVar33 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    uVar24 = vpcmpeqd_avx512vl((undefined1  [16])valid_i->field_0,auVar33);
    uVar24 = uVar24 & 0xf;
    if ((byte)uVar24 != 0) {
      auVar33 = *(undefined1 (*) [16])(ray + 0x40);
      auVar27 = *(undefined1 (*) [16])(ray + 0x50);
      auVar3 = *(undefined1 (*) [16])(ray + 0x60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar51 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar31 = *(undefined1 (*) [16])ray;
      auVar34._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
      auVar34._8_4_ = -auVar31._8_4_;
      auVar34._12_4_ = -auVar31._12_4_;
      auVar25 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),(undefined1  [16])0x0);
      bVar22 = (bool)((byte)uVar24 & 1);
      aVar26._0_4_ = (uint)bVar22 * auVar25._0_4_ | (uint)!bVar22 * 0x7f800000;
      bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
      aVar26._4_4_ = (uint)bVar22 * auVar25._4_4_ | (uint)!bVar22 * 0x7f800000;
      bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
      aVar26._8_4_ = (uint)bVar22 * auVar25._8_4_ | (uint)!bVar22 * 0x7f800000;
      bVar22 = SUB81(uVar24 >> 3,0);
      aVar26._12_4_ = (uint)bVar22 * auVar25._12_4_ | (uint)!bVar22 * 0x7f800000;
      auVar25 = *(undefined1 (*) [16])(ray + 0x10);
      auVar32._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar32._8_4_ = auVar25._8_4_ ^ 0x80000000;
      auVar32._12_4_ = auVar25._12_4_ ^ 0x80000000;
      auVar25 = *(undefined1 (*) [16])(ray + 0x20);
      auVar35._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar35._8_4_ = auVar25._8_4_ ^ 0x80000000;
      auVar35._12_4_ = auVar25._12_4_ ^ 0x80000000;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar17;
      stack_near[1].field_0 = aVar26;
      if (sVar17 != 0xfffffffffffffff8) {
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar25 = vandps_avx(auVar33,auVar28);
        auVar29._8_4_ = 0x219392ef;
        auVar29._0_8_ = 0x219392ef219392ef;
        auVar29._12_4_ = 0x219392ef;
        uVar24 = vcmpps_avx512vl(auVar25,auVar29,1);
        bVar22 = (bool)((byte)uVar24 & 1);
        auVar25._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar33._0_4_;
        bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar33._4_4_;
        bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar33._8_4_;
        bVar22 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar33._12_4_;
        auVar33 = vandps_avx(auVar27,auVar28);
        uVar24 = vcmpps_avx512vl(auVar33,auVar29,1);
        bVar22 = (bool)((byte)uVar24 & 1);
        auVar30._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._0_4_;
        bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._4_4_;
        bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._8_4_;
        bVar22 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._12_4_;
        auVar33 = vandps_avx(auVar3,auVar28);
        uVar24 = vcmpps_avx512vl(auVar33,auVar29,1);
        bVar22 = (bool)((byte)uVar24 & 1);
        auVar27._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar3._0_4_;
        bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar3._4_4_;
        bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar3._8_4_;
        bVar22 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar3._12_4_;
        auVar28 = vrcp14ps_avx512vl(auVar25);
        auVar36._8_4_ = 0x3f800000;
        auVar36._0_8_ = 0x3f8000003f800000;
        auVar36._12_4_ = 0x3f800000;
        auVar33 = vfnmadd213ps_fma(auVar25,auVar28,auVar36);
        auVar29 = vrcp14ps_avx512vl(auVar30);
        auVar3 = vfnmadd213ps_fma(auVar30,auVar29,auVar36);
        auVar30 = vrcp14ps_avx512vl(auVar27);
        auVar25 = vfnmadd213ps_fma(auVar27,auVar30,auVar36);
        auVar27 = vfmadd132ps_fma(auVar33,auVar28,auVar28);
        auVar3 = vfmadd132ps_fma(auVar3,auVar29,auVar29);
        auVar25 = vfmadd132ps_fma(auVar25,auVar30,auVar30);
        auVar52._0_4_ = auVar27._0_4_ * -auVar31._0_4_;
        auVar52._4_4_ = auVar27._4_4_ * -auVar31._4_4_;
        auVar52._8_4_ = auVar27._8_4_ * auVar34._8_4_;
        auVar52._12_4_ = auVar27._12_4_ * auVar34._12_4_;
        auVar31 = vmulps_avx512vl(auVar3,auVar32);
        auVar32 = vmulps_avx512vl(auVar25,auVar35);
        auVar33 = vpcmpeqd_avx(auVar34,auVar34);
        uVar24 = vpcmpeqd_avx512vl((undefined1  [16])valid_i->field_0,auVar33);
        uVar24 = uVar24 & 0xf;
        pNVar14 = stack_node + 1;
        auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar34 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0);
        bVar22 = (bool)((byte)uVar24 & 1);
        bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar6 = SUB81(uVar24 >> 3,0);
        auVar53 = ZEXT1664(CONCAT412((uint)bVar6 * auVar34._12_4_ | (uint)!bVar6 * auVar33._12_4_,
                                     CONCAT48((uint)bVar5 * auVar34._8_4_ |
                                              (uint)!bVar5 * auVar33._8_4_,
                                              CONCAT44((uint)bVar4 * auVar34._4_4_ |
                                                       (uint)!bVar4 * auVar33._4_4_,
                                                       (uint)bVar22 * auVar34._0_4_ |
                                                       (uint)!bVar22 * auVar33._0_4_))));
        paVar20 = &stack_near[2].field_0;
        do {
          paVar1 = paVar20 + -1;
          auVar43 = ZEXT1664((undefined1  [16])*paVar1);
          paVar20 = paVar20 + -1;
          auVar33 = auVar53._0_16_;
          uVar7 = vcmpps_avx512vl((undefined1  [16])*paVar1,auVar33,1);
          if ((char)uVar7 != '\0') {
            while( true ) {
              uVar21 = (uint)sVar17;
              if ((sVar17 & 8) != 0) break;
              uVar7 = vcmpps_avx512vl(auVar33,auVar43._0_16_,6);
              uVar16 = sVar17 & 0xfffffffffffffff0;
              uVar24 = 0;
              auVar43 = ZEXT1664(auVar51._0_16_);
              lVar19 = -0x20;
              sVar17 = 8;
              do {
                sVar18 = *(size_t *)(uVar16 + 0x40 + lVar19 * 2);
                if (sVar18 == 8) break;
                uVar2 = *(undefined4 *)(uVar16 + 0x120 + lVar19);
                auVar45._4_4_ = uVar2;
                auVar45._0_4_ = uVar2;
                auVar45._8_4_ = uVar2;
                auVar45._12_4_ = uVar2;
                auVar34 = *(undefined1 (*) [16])(ray + 0x70);
                uVar2 = *(undefined4 *)(uVar16 + 0x60 + lVar19);
                auVar37._4_4_ = uVar2;
                auVar37._0_4_ = uVar2;
                auVar37._8_4_ = uVar2;
                auVar37._12_4_ = uVar2;
                auVar35 = vfmadd213ps_avx512vl(auVar45,auVar34,auVar37);
                uVar2 = *(undefined4 *)(uVar16 + 0x160 + lVar19);
                auVar46._4_4_ = uVar2;
                auVar46._0_4_ = uVar2;
                auVar46._8_4_ = uVar2;
                auVar46._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar16 + 0xa0 + lVar19);
                auVar38._4_4_ = uVar2;
                auVar38._0_4_ = uVar2;
                auVar38._8_4_ = uVar2;
                auVar38._12_4_ = uVar2;
                auVar30 = vfmadd213ps_avx512vl(auVar46,auVar34,auVar38);
                uVar2 = *(undefined4 *)(uVar16 + 0x1a0 + lVar19);
                auVar47._4_4_ = uVar2;
                auVar47._0_4_ = uVar2;
                auVar47._8_4_ = uVar2;
                auVar47._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar16 + 0xe0 + lVar19);
                auVar39._4_4_ = uVar2;
                auVar39._0_4_ = uVar2;
                auVar39._8_4_ = uVar2;
                auVar39._12_4_ = uVar2;
                auVar29 = vfmadd213ps_avx512vl(auVar47,auVar34,auVar39);
                uVar2 = *(undefined4 *)(uVar16 + 0x140 + lVar19);
                auVar48._4_4_ = uVar2;
                auVar48._0_4_ = uVar2;
                auVar48._8_4_ = uVar2;
                auVar48._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar16 + 0x80 + lVar19);
                auVar40._4_4_ = uVar2;
                auVar40._0_4_ = uVar2;
                auVar40._8_4_ = uVar2;
                auVar40._12_4_ = uVar2;
                auVar36 = vfmadd213ps_avx512vl(auVar48,auVar34,auVar40);
                uVar2 = *(undefined4 *)(uVar16 + 0x180 + lVar19);
                auVar49._4_4_ = uVar2;
                auVar49._0_4_ = uVar2;
                auVar49._8_4_ = uVar2;
                auVar49._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar16 + 0xc0 + lVar19);
                auVar10._4_4_ = uVar2;
                auVar10._0_4_ = uVar2;
                auVar10._8_4_ = uVar2;
                auVar10._12_4_ = uVar2;
                auVar37 = vfmadd213ps_avx512vl(auVar49,auVar34,auVar10);
                uVar2 = *(undefined4 *)(uVar16 + 0x1c0 + lVar19);
                auVar50._4_4_ = uVar2;
                auVar50._0_4_ = uVar2;
                auVar50._8_4_ = uVar2;
                auVar50._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar16 + 0x100 + lVar19);
                auVar11._4_4_ = uVar2;
                auVar11._0_4_ = uVar2;
                auVar11._8_4_ = uVar2;
                auVar11._12_4_ = uVar2;
                auVar38 = vfmadd213ps_avx512vl(auVar50,auVar34,auVar11);
                auVar28 = vfmadd213ps_fma(auVar35,auVar27,auVar52);
                auVar39 = vfmadd213ps_avx512vl(auVar30,auVar3,auVar31);
                auVar40 = vfmadd213ps_avx512vl(auVar29,auVar25,auVar32);
                auVar29 = vfmadd213ps_fma(auVar36,auVar27,auVar52);
                auVar36 = vfmadd213ps_avx512vl(auVar37,auVar3,auVar31);
                auVar37 = vfmadd213ps_avx512vl(auVar38,auVar25,auVar32);
                auVar35 = vpminsd_avx(auVar28,auVar29);
                auVar30 = vpminsd_avx(auVar39,auVar36);
                auVar35 = vpmaxsd_avx(auVar35,auVar30);
                auVar30 = vpminsd_avx(auVar40,auVar37);
                auVar35 = vpmaxsd_avx(auVar35,auVar30);
                auVar30 = vpmaxsd_avx(auVar28,auVar29);
                auVar28 = vpmaxsd_avx(auVar39,auVar36);
                auVar29 = vpminsd_avx(auVar30,auVar28);
                auVar30 = vpmaxsd_avx(auVar40,auVar37);
                auVar28 = vpmaxsd_avx(auVar35,(undefined1  [16])aVar26);
                auVar30 = vpminsd_avx512vl(auVar30,auVar33);
                auVar30 = vpminsd_avx(auVar29,auVar30);
                uVar8 = vcmpps_avx512vl(auVar28,auVar30,2);
                bVar23 = (byte)uVar8;
                if ((uVar21 & 7) == 6) {
                  uVar2 = *(undefined4 *)(uVar16 + 0x200 + lVar19);
                  auVar12._4_4_ = uVar2;
                  auVar12._0_4_ = uVar2;
                  auVar12._8_4_ = uVar2;
                  auVar12._12_4_ = uVar2;
                  uVar8 = vcmpps_avx512vl(auVar34,auVar12,1);
                  uVar2 = *(undefined4 *)(uVar16 + 0x1e0 + lVar19);
                  auVar13._4_4_ = uVar2;
                  auVar13._0_4_ = uVar2;
                  auVar13._8_4_ = uVar2;
                  auVar13._12_4_ = uVar2;
                  uVar9 = vcmpps_avx512vl(auVar34,auVar13,0xd);
                  bVar23 = (byte)uVar8 & (byte)uVar9 & bVar23;
                }
                bVar23 = bVar23 & (byte)uVar7;
                if (bVar23 != 0) {
                  auVar35 = vblendmps_avx512vl(auVar51._0_16_,auVar35);
                  aVar41._0_4_ = (uint)(bVar23 & 1) * auVar35._0_4_ |
                                 (uint)!(bool)(bVar23 & 1) * auVar34._0_4_;
                  bVar22 = (bool)(bVar23 >> 1 & 1);
                  aVar41._4_4_ = (uint)bVar22 * auVar35._4_4_ | (uint)!bVar22 * auVar34._4_4_;
                  bVar22 = (bool)(bVar23 >> 2 & 1);
                  aVar41._8_4_ = (uint)bVar22 * auVar35._8_4_ | (uint)!bVar22 * auVar34._8_4_;
                  bVar22 = (bool)(bVar23 >> 3 & 1);
                  aVar41._12_4_ = (uint)bVar22 * auVar35._12_4_ | (uint)!bVar22 * auVar34._12_4_;
                  aVar42 = auVar43._0_16_;
                  uVar8 = vcmpps_avx512vl((undefined1  [16])aVar41,(undefined1  [16])aVar42,1);
                  sVar15 = sVar18;
                  aVar44 = aVar41;
                  if (((char)uVar8 == '\0') ||
                     (bVar22 = sVar17 != 8, sVar15 = sVar17, sVar17 = sVar18, aVar44 = aVar42,
                     aVar42 = aVar41, bVar22)) {
                    aVar41 = aVar42;
                    uVar24 = uVar24 + 1;
                    pNVar14->ptr = sVar15;
                    pNVar14 = pNVar14 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar20->v = aVar44;
                    paVar20 = paVar20 + 1;
                    sVar18 = sVar17;
                  }
                  auVar43 = ZEXT1664((undefined1  [16])aVar41);
                  sVar17 = sVar18;
                }
                lVar19 = lVar19 + 4;
              } while (lVar19 != 0);
              if (sVar17 == 8) goto LAB_007774e5;
              if (1 < uVar24) {
                aVar44 = paVar20[-2];
                aVar41 = paVar20[-1];
                uVar7 = vcmpps_avx512vl((undefined1  [16])aVar44,(undefined1  [16])aVar41,1);
                aVar42 = aVar41;
                if ((char)uVar7 != '\0') {
                  paVar20[-2] = aVar41;
                  paVar20[-1] = aVar44;
                  auVar34 = vpermilps_avx(*(undefined1 (*) [16])(pNVar14 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar14 + -2) = auVar34;
                  aVar42 = aVar44;
                  aVar44 = aVar41;
                }
                if (uVar24 != 2) {
                  aVar41 = paVar20[-3];
                  uVar7 = vcmpps_avx512vl((undefined1  [16])aVar41,(undefined1  [16])aVar42,1);
                  if ((char)uVar7 != '\0') {
                    paVar20[-3] = aVar42;
                    paVar20[-1] = aVar41;
                    sVar18 = pNVar14[-3].ptr;
                    pNVar14[-3].ptr = pNVar14[-1].ptr;
                    pNVar14[-1].ptr = sVar18;
                    aVar41 = aVar42;
                  }
                  uVar7 = vcmpps_avx512vl((undefined1  [16])aVar41,(undefined1  [16])aVar44,1);
                  if ((char)uVar7 != '\0') {
                    paVar20[-3] = aVar44;
                    paVar20[-2] = aVar41;
                    auVar34 = vpermilps_avx(*(undefined1 (*) [16])(pNVar14 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar14 + -3) = auVar34;
                  }
                }
              }
            }
            if (sVar17 == 0xfffffffffffffff8) {
              return;
            }
            uVar24 = vcmpps_avx512vl(auVar33,auVar43._0_16_,6);
            valid_leaf.v = (__mmask8)uVar24;
            if (valid_leaf.v != '\0') {
              lVar19 = (ulong)(uVar21 & 0xf) - 8;
              if (lVar19 != 0) {
                prim = (Primitive_conflict4 *)(sVar17 & 0xfffffffffffffff0);
                do {
                  InstanceArrayIntersectorKMB<4>::intersect(&valid_leaf,&pre,ray,context,prim);
                  prim = prim + 1;
                  lVar19 = lVar19 + -1;
                } while (lVar19 != 0);
                uVar24 = (ulong)valid_leaf.v;
                auVar51 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              bVar22 = (bool)((byte)uVar24 & 1);
              bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar24 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar24 >> 3) & 1);
              auVar53 = ZEXT1664(CONCAT412((uint)bVar6 * *(int *)(ray + 0x8c) |
                                           (uint)!bVar6 * auVar53._12_4_,
                                           CONCAT48((uint)bVar5 * *(int *)(ray + 0x88) |
                                                    (uint)!bVar5 * auVar53._8_4_,
                                                    CONCAT44((uint)bVar4 * *(int *)(ray + 0x84) |
                                                             (uint)!bVar4 * auVar53._4_4_,
                                                             (uint)bVar22 * *(int *)(ray + 0x80) |
                                                             (uint)!bVar22 * auVar53._0_4_))));
            }
          }
LAB_007774e5:
          sVar17 = pNVar14[-1].ptr;
          pNVar14 = pNVar14 + -1;
        } while (sVar17 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }